

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

void printf_token(Token token)

{
  char *pcVar1;
  Literal *pLVar2;
  char *__format;
  
  pLVar2 = token.literal;
  switch(token.token_type) {
  case NULL_TOKEN:
    printf(" null ");
    return;
  default:
    return;
  case IDENTIFIER_TOKEN:
    pcVar1 = *(char **)(pLVar2 + 2);
    __format = " %s ";
    break;
  case INTEGER_TOKEN:
    pcVar1 = *(char **)(pLVar2 + 2);
    __format = " %lld ";
    break;
  case FLOAT_TOKEN:
    printf(" %Lf ");
    return;
  case BOOL_TOKEN:
    pcVar1 = "false";
    if ((char)pLVar2[1].literal_type != LiteralTypeBoolLiteral) {
      pcVar1 = "true";
    }
    __format = " %s ";
    break;
  case STRING_LITERAL_TOKEN:
    pcVar1 = *(char **)(pLVar2 + 2);
    __format = " \"%s\" ";
  }
  printf(__format,pcVar1);
  return;
}

Assistant:

void printf_token(Token token) {
  switch (token.token_type) {
    case NULL_TOKEN: {
      printf(" null ");

      break;
    }

    case IDENTIFIER_TOKEN: {
      printf(" %s ", ((StringLiteral *)token.literal)->string_literal);

      break;
    }

    case INTEGER_TOKEN: {
      printf(" %lld ", ((IntegerLiteral *)token.literal)->integer_literal);

      break;
    }

    case FLOAT_TOKEN: {
      printf(" %Lf ", ((FloatLiteral *)token.literal)->float_literal);

      break;
    }

    case BOOL_TOKEN: {
      printf(" %s ", ((BoolLiteral *)token.literal)->bool_literal ? "true" : "false");

      break;
    }

    case STRING_LITERAL_TOKEN: {
      printf(" \"%s\" ", ((StringLiteral *)token.literal)->string_literal);

      break;
    }
  }
}